

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QDockWidgetGroupWindow * __thiscall
QMainWindowLayout::createTabbedDockWindow(QMainWindowLayout *this)

{
  long lVar1;
  QDockWidgetGroupLayout *this_00;
  QDockWidgetGroupWindow *parent;
  QDockWidgetGroupWindow *in_RDI;
  long in_FS_OFFSET;
  QDockWidgetGroupWindow *f;
  undefined4 in_stack_ffffffffffffffb8;
  WindowType in_stack_ffffffffffffffbc;
  QDockWidgetGroupLayout *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDockWidgetGroupLayout *)operator_new(0x58);
  parent = (QDockWidgetGroupWindow *)QLayout::parentWidget((QLayout *)this_00);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffffbc);
  QDockWidgetGroupWindow::QDockWidgetGroupWindow
            (in_RDI,(QWidget *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)parent >> 0x20,0));
  this_01 = this_00;
  operator_new(0x170);
  QDockWidgetGroupLayout::QDockWidgetGroupLayout(this_01,parent);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDockWidgetGroupWindow *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDockWidgetGroupWindow *QMainWindowLayout::createTabbedDockWindow()
{
    QDockWidgetGroupWindow* f = new QDockWidgetGroupWindow(parentWidget(), Qt::Tool);
    new QDockWidgetGroupLayout(f);
    return f;
}